

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

bool __thiscall
xatlas::internal::BitImage::canBlit
          (BitImage *this,BitImage *image,uint32_t offsetX,uint32_t offsetY)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  uVar1 = image->m_height;
  if (uVar1 != 0) {
    bVar9 = false;
    uVar7 = 0;
    do {
      if (uVar7 + offsetY < this->m_height) {
        uVar3 = 0;
        do {
          uVar2 = (uint)uVar3;
          uVar5 = uVar2 + offsetX;
          if (this->m_width <= uVar5) break;
          uVar4 = (uVar5 >> 6) + (uVar7 + offsetY) * this->m_rowStride;
          if (((this->m_data).m_base.size <= uVar4) ||
             (uVar8 = (int)(uVar3 >> 6) + image->m_rowStride * uVar7,
             (image->m_data).m_base.size <= uVar8)) {
            __assert_fail("index < m_base.size",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                          ,0x4a8,
                          "const T &xatlas::internal::Array<unsigned long>::operator[](uint32_t) const [T = unsigned long]"
                         );
          }
          uVar5 = uVar5 & 0x3f;
          uVar6 = uVar2 & 0x3f;
          if ((*(ulong *)((image->m_data).m_base.buffer + (ulong)uVar8 * 8) >> (sbyte)uVar6 &
              *(ulong *)((this->m_data).m_base.buffer + (ulong)uVar4 * 8) >> (sbyte)uVar5) != 0) {
            return bVar9;
          }
          if (uVar6 < uVar5) {
            uVar6 = uVar5;
          }
          uVar2 = (uVar2 - uVar6) + 0x40;
          uVar3 = (ulong)uVar2;
        } while (uVar2 < image->m_width);
      }
      uVar7 = uVar7 + 1;
      bVar9 = uVar1 <= uVar7;
    } while (uVar7 != uVar1);
  }
  return true;
}

Assistant:

bool canBlit(const BitImage &image, uint32_t offsetX, uint32_t offsetY) const
	{
		for (uint32_t y = 0; y < image.m_height; y++) {
			const uint32_t thisY = y + offsetY;
			if (thisY >= m_height)
				continue;
			uint32_t x = 0;
			for (;;) {
				const uint32_t thisX = x + offsetX;
				if (thisX >= m_width)
					break;
				const uint32_t thisBlockShift = thisX % 64;
				const uint64_t thisBlock = m_data[(thisX >> 6) + thisY * m_rowStride] >> thisBlockShift;
				const uint32_t blockShift = x % 64;
				const uint64_t block = image.m_data[(x >> 6) + y * image.m_rowStride] >> blockShift;
				if ((thisBlock & block) != 0)
					return false;
				x += 64 - max(thisBlockShift, blockShift);
				if (x >= image.m_width)
					break;
			}
		}
		return true;
	}